

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O3

void Ioa_WriteAiger(Aig_Man_t *pMan,char *pFileName,int fWriteSymbols,int fCompact)

{
  size_t __size;
  ulong uVar1;
  void **ppvVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  FILE *__stream;
  long lVar6;
  Vec_Int_t *vLits;
  Vec_Str_t *__ptr;
  Vec_Ptr_t *pVVar7;
  void *pvVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  
  if (pMan->nObjs[3] == 0) {
    puts("AIG cannot be written because it has no POs.");
    return;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Ioa_WriteAiger(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  (pMan->pConst1->field_5).iData = 0;
  pVVar7 = pMan->vCis;
  if (pVVar7->nSize < 1) {
    iVar5 = 1;
  }
  else {
    lVar6 = 0;
    do {
      ppvVar2 = pVVar7->pArray + lVar6;
      lVar6 = lVar6 + 1;
      *(int *)((long)*ppvVar2 + 0x28) = (int)lVar6;
      pVVar7 = pMan->vCis;
    } while (lVar6 < pVVar7->nSize);
    iVar5 = (int)lVar6 + 1;
  }
  pVVar7 = pMan->vObjs;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      pvVar8 = pVVar7->pArray[lVar6];
      if ((pvVar8 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar8 + 0x18) & 7) - 7)) {
        *(int *)((long)pvVar8 + 0x28) = iVar5;
        iVar5 = iVar5 + 1;
        pVVar7 = pMan->vObjs;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar7->nSize);
  }
  pcVar10 = "2";
  if (fCompact == 0) {
    pcVar10 = "";
  }
  uVar14 = pMan->nRegs;
  uVar13 = pMan->nObjs[6] + pMan->nObjs[5];
  uVar17 = 0;
  if (pMan->nConstrs == 0) {
    uVar17 = (ulong)(pMan->nObjs[3] - uVar14);
  }
  fprintf(__stream,"aig%s %u %u %u %u %u",pcVar10,(ulong)(uVar13 + pMan->nObjs[2]),
          (ulong)(pMan->nObjs[2] - uVar14),(ulong)uVar14,uVar17,(ulong)uVar13);
  if (pMan->nConstrs != 0) {
    fprintf(__stream," %u %u",(ulong)(uint)(pMan->nObjs[3] - (pMan->nRegs + pMan->nConstrs)));
  }
  fputc(10,__stream);
  Aig_ManInvertConstraints(pMan);
  if (fCompact == 0) {
    iVar5 = pMan->nObjs[3];
    iVar9 = pMan->nRegs;
    uVar14 = iVar5 - iVar9;
    pVVar7 = pMan->vCos;
    if ((int)uVar14 < pVVar7->nSize) {
      uVar17 = (ulong)uVar14;
      do {
        if ((int)uVar14 < 0) goto LAB_007eb242;
        uVar1 = *(ulong *)((long)pVVar7->pArray[uVar17] + 8);
        iVar5 = *(int *)((uVar1 & 0xfffffffffffffffe) + 0x28);
        fprintf(__stream,"%u\n",(ulong)(((uint)(iVar5 == 0) ^ (uint)uVar1 & 1) + iVar5 * 2));
        uVar17 = uVar17 + 1;
        pVVar7 = pMan->vCos;
      } while ((int)uVar17 < pVVar7->nSize);
      iVar9 = pMan->nRegs;
      iVar5 = pMan->nObjs[3];
    }
    if (iVar9 < iVar5) {
      lVar6 = 0;
      do {
        if (pMan->vCos->nSize <= lVar6) {
LAB_007eb242:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar17 = *(ulong *)((long)pMan->vCos->pArray[lVar6] + 8);
        iVar5 = *(int *)((uVar17 & 0xfffffffffffffffe) + 0x28);
        fprintf(__stream,"%u\n",(ulong)(((uint)(iVar5 == 0) ^ (uint)uVar17 & 1) + iVar5 * 2));
        lVar6 = lVar6 + 1;
      } while (lVar6 < (long)pMan->nObjs[3] - (long)pMan->nRegs);
    }
  }
  else {
    vLits = Ioa_WriteAigerLiterals(pMan);
    __ptr = Ioa_WriteEncodeLiterals(vLits);
    pcVar10 = __ptr->pArray;
    fwrite(pcVar10,1,(long)__ptr->nSize,__stream);
    if (pcVar10 != (char *)0x0) {
      free(pcVar10);
    }
    free(__ptr);
    if (vLits->pArray != (int *)0x0) {
      free(vLits->pArray);
    }
    free(vLits);
  }
  Aig_ManInvertConstraints(pMan);
  lVar18 = (long)pMan->nObjs[6] + (long)pMan->nObjs[5];
  __size = lVar18 * 6 + 100;
  pvVar8 = malloc(__size);
  lVar6 = (long)pMan->vObjs->nSize;
  if (lVar6 < 1) {
    iVar5 = 0;
  }
  else {
    ppvVar2 = pMan->vObjs->pArray;
    lVar11 = 0;
    iVar5 = 0;
    do {
      pvVar3 = ppvVar2[lVar11];
      if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
        uVar14 = ((uint)*(ulong *)((long)pvVar3 + 8) & 1) +
                 *(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28) * 2;
        uVar13 = ((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) +
                 *(int *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x28) * 2;
        if (uVar14 == uVar13) {
          __assert_fail("uLit0 != uLit1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ioa/ioaWriteAig.c"
                        ,0x21c,"void Ioa_WriteAiger(Aig_Man_t *, char *, int, int)");
        }
        uVar12 = uVar13;
        if (uVar14 >= uVar13 && uVar14 != uVar13) {
          uVar12 = uVar14;
        }
        if (uVar14 < uVar13) {
          uVar13 = uVar14;
        }
        uVar14 = *(int *)((long)pvVar3 + 0x28) * 2 - uVar12;
        if (0x7f < uVar14) {
          pbVar15 = (byte *)((long)iVar5 + (long)pvVar8);
          uVar16 = uVar14;
          do {
            *pbVar15 = (byte)uVar16 | 0x80;
            uVar14 = uVar16 >> 7;
            pbVar15 = pbVar15 + 1;
            iVar5 = iVar5 + 1;
            bVar4 = 0x3fff < uVar16;
            uVar16 = uVar14;
          } while (bVar4);
        }
        iVar9 = iVar5 + 1;
        *(char *)((long)pvVar8 + (long)iVar5) = (char)uVar14;
        uVar12 = uVar12 - uVar13;
        if (0x7f < uVar12) {
          pbVar15 = (byte *)((long)iVar9 + (long)pvVar8);
          uVar14 = uVar12;
          do {
            *pbVar15 = (byte)uVar14 | 0x80;
            uVar12 = uVar14 >> 7;
            pbVar15 = pbVar15 + 1;
            iVar9 = iVar9 + 1;
            bVar4 = 0x3fff < uVar14;
            uVar14 = uVar12;
          } while (bVar4);
        }
        *(char *)((long)pvVar8 + (long)iVar9) = (char)uVar12;
        if ((int)lVar18 * 6 + 0x5a <= iVar9) {
          puts(
              "Ioa_WriteAiger(): AIGER generation has failed because the allocated buffer is too small."
              );
          goto LAB_007eb21e;
        }
        iVar5 = iVar9 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar6);
  }
  if ((int)__size <= iVar5) {
    __assert_fail("Pos < nBufferSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ioa/ioaWriteAig.c"
                  ,0x22c,"void Ioa_WriteAiger(Aig_Man_t *, char *, int, int)");
  }
  fwrite(pvVar8,1,(long)iVar5,__stream);
  if (pvVar8 != (void *)0x0) {
    free(pvVar8);
  }
  fputc(99,__stream);
  if (pMan->pName != (char *)0x0) {
    fprintf(__stream,"n%s%c",pMan->pName,0);
  }
  pcVar10 = Ioa_TimeStamp();
  fprintf(__stream,"\nThis file was produced by the IOA package in ABC on %s\n",pcVar10);
  fprintf(__stream,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger");
LAB_007eb21e:
  fclose(__stream);
  return;
}

Assistant:

void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact )
{
//    Bar_Progress_t * pProgress;
    FILE * pFile;
    Aig_Obj_t * pObj, * pDriver;
    int i, nNodes, nBufferSize, Pos;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;

    if ( Aig_ManCoNum(pMan) == 0 )
    {
        printf( "AIG cannot be written because it has no POs.\n" );
        return;
    }

//    assert( Aig_ManIsStrash(pMan) );
    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Ioa_WriteAiger(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
/*
    Aig_ManForEachLatch( pMan, pObj, i )
        if ( !Aig_LatchIsInit0(pObj) )
        {
            fprintf( stdout, "Ioa_WriteAiger(): Cannot write AIGER format with non-0 latch init values. Run \"zero\".\n" );
            return;
        }
*/
    // set the node numbers to be used in the output file
    nNodes = 0;
    Ioa_ObjSetAigerNum( Aig_ManConst1(pMan), nNodes++ );
    Aig_ManForEachCi( pMan, pObj, i )
        Ioa_ObjSetAigerNum( pObj, nNodes++ );
    Aig_ManForEachNode( pMan, pObj, i )
        Ioa_ObjSetAigerNum( pObj, nNodes++ );

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Aig_ManCiNum(pMan) + Aig_ManNodeNum(pMan), 
        Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan),
        Aig_ManRegNum(pMan),
        Aig_ManConstrNum(pMan) ? 0 : Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan),
        Aig_ManNodeNum(pMan) );
    // write the extended header "B C J F"
    if ( Aig_ManConstrNum(pMan) )
        fprintf( pFile, " %u %u", Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) - Aig_ManConstrNum(pMan), Aig_ManConstrNum(pMan) );
    fprintf( pFile, "\n" ); 

    // if the driver node is a constant, we need to complement the literal below
    // because, in the AIGER format, literal 0/1 is represented as number 0/1
    // while, in ABC, constant 1 node has number 0 and so literal 0/1 will be 1/0

    Aig_ManInvertConstraints( pMan );
    if ( !fCompact ) 
    {
        // write latch drivers
        Aig_ManForEachLiSeq( pMan, pObj, i )
        {
            pDriver = Aig_ObjFanin0(pObj);
            fprintf( pFile, "%u\n", Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
        }

        // write PO drivers
        Aig_ManForEachPoSeq( pMan, pObj, i )
        {
            pDriver = Aig_ObjFanin0(pObj);
            fprintf( pFile, "%u\n", Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
        }
    }
    else
    {
        Vec_Int_t * vLits = Ioa_WriteAigerLiterals( pMan );
        Vec_Str_t * vBinary = Ioa_WriteEncodeLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Aig_ManInvertConstraints( pMan );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 6 * Aig_ManNodeNum(pMan) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
//    pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(pMan) );
    Aig_ManForEachNode( pMan, pObj, i )
    {
//        Bar_ProgressUpdate( pProgress, i, NULL );
        uLit  = Ioa_ObjMakeLit( Ioa_ObjAigerNum(pObj), 0 );
        uLit0 = Ioa_ObjMakeLit( Ioa_ObjAigerNum(Aig_ObjFanin0(pObj)), Aig_ObjFaninC0(pObj) );
        uLit1 = Ioa_ObjMakeLit( Ioa_ObjAigerNum(Aig_ObjFanin1(pObj)), Aig_ObjFaninC1(pObj) );
        assert( uLit0 != uLit1 );
        if ( uLit0 > uLit1 )
        {
            int Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        Pos = Ioa_WriteAigerEncode( pBuffer, Pos, uLit  - uLit1 );
        Pos = Ioa_WriteAigerEncode( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Ioa_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n" );
            fclose( pFile );
            return;
        }
    }
    assert( Pos < nBufferSize );
//    Bar_ProgressStop( pProgress );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );
/*
    // write the symbol table
    if ( fWriteSymbols )
    {
        int bads;
        // write PIs
        Aig_ManForEachPiSeq( pMan, pObj, i )
            fprintf( pFile, "i%d %s\n", i, Aig_ObjName(pObj) );
        // write latches
        Aig_ManForEachLoSeq( pMan, pObj, i )
            fprintf( pFile, "l%d %s\n", i, Aig_ObjName(Aig_ObjFanout0(pObj)) );
        // write POs
        bads = Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) - Aig_ManConstrNum(pMan);
        Aig_ManForEachPoSeq( pMan, pObj, i )
            if ( !Aig_ManConstrNum(pMan) )
                fprintf( pFile, "o%d %s\n", i, Aig_ObjName(pObj) );
            else if ( i < bads )
                fprintf( pFile, "b%d %s\n", i, Aig_ObjName(pObj) );
            else
                fprintf( pFile, "c%d %s\n", i - bads, Aig_ObjName(pObj) );
    }
*/
    // write the comment
    fprintf( pFile, "c" );
    if ( pMan->pName )
        fprintf( pFile, "n%s%c", pMan->pName, '\0' );
    fprintf( pFile, "\nThis file was produced by the IOA package in ABC on %s\n", Ioa_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
    fclose( pFile );
}